

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O3

bool jsoncons::detail::dtoa_fixed<jsoncons::string_sink<std::__cxx11::string>>
               (double val,char decimal_point,
               string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *result)

{
  uint uVar1;
  bool bVar2;
  type_conflict7 tVar3;
  chars_to to_double;
  char buffer [100];
  chars_to local_a8;
  char local_88 [112];
  
  if ((val == 0.0) && (!NAN(val))) {
    std::__cxx11::string::push_back((char)result->buf_ptr);
    std::__cxx11::string::push_back((char)result->buf_ptr);
    std::__cxx11::string::push_back((char)result->buf_ptr);
    return true;
  }
  chars_to::chars_to(&local_a8);
  uVar1 = snprintf(local_88,100,"%1.*f",val,0xf);
  if (-1 < (int)uVar1) {
    tVar3 = chars_to::operator()(&local_a8,local_88,100);
    if (((tVar3 == val) && (!NAN(tVar3) && !NAN(val))) ||
       (uVar1 = snprintf(local_88,100,"%1.*f",val,0x11), -1 < (int)uVar1)) {
      bVar2 = true;
      dump_buffer<jsoncons::string_sink<std::__cxx11::string>>
                (local_88,(ulong)uVar1,decimal_point,result);
      goto LAB_001dc0e1;
    }
  }
  bVar2 = false;
LAB_001dc0e1:
  if (local_a8.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool dtoa_fixed(double val, char decimal_point, Result& result, std::false_type)
    {
        if (val == 0)
        {
            result.push_back('0');
            result.push_back('.');
            result.push_back('0');
            return true;
        }

        const jsoncons::detail::chars_to to_double;

        char buffer[100];
        int precision = std::numeric_limits<double>::digits10;
        int length = snprintf(buffer, sizeof(buffer), "%1.*f", precision, val);
        if (length < 0)
        {
            return false;
        }
        if (to_double(buffer, sizeof(buffer)) != val)
        {
            const int precision2 = std::numeric_limits<double>::max_digits10;
            length = snprintf(buffer, sizeof(buffer), "%1.*f", precision2, val);
            if (length < 0)
            {
                return false;
            }
        }
        dump_buffer(buffer, length, decimal_point, result);
        return true;
    }